

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool list_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  gravity_value_t value_04;
  gravity_fiber_t *fiber;
  gravity_int_t n;
  char local_1068 [8];
  char _buffer [4096];
  gravity_value_t value;
  uint32_t count;
  gravity_list_t *list;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = ((args->field_1).p)->objclass;
  if ((int)pgVar1 == 0) {
    value_04.field_1.n = 0;
    value_04.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value_04,rindex);
    vm_local._7_1_ = true;
  }
  else if ((args[1].isa == gravity_class_null) && (args[1].field_1.n == 0)) {
    value_03.field_1.n = 0;
    value_03.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_03,rindex);
    vm_local._7_1_ = true;
  }
  else {
    _buffer._4088_8_ = args[1].isa;
    if ((gravity_class_t *)_buffer._4088_8_ == gravity_class_int) {
      if ((long)((long)&(args[1].field_1.p)->isa + 1) < (long)((ulong)pgVar1 & 0xffffffff)) {
        value_00.field_1.p = (gravity_object_t *)((long)&(args[1].field_1.p)->isa + 1);
        value_00.isa = gravity_class_int;
        gravity_vm_setslot(vm,value_00,rindex);
        vm_local._7_1_ = true;
      }
      else {
        value_01.field_1.n = 0;
        value_01.isa = gravity_class_bool;
        gravity_vm_setslot(vm,value_01,rindex);
        vm_local._7_1_ = true;
      }
    }
    else {
      snprintf(local_1068,0x1000,"Iterator expects a numeric value here.");
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1068);
      value_02.field_1.n = 0;
      value_02.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_02,rindex);
      vm_local._7_1_ = false;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool list_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));

    // check for empty list first
    register uint32_t count = (uint32_t)marray_size(list->array);
    if (count == 0) RETURN_VALUE(VALUE_FROM_FALSE, rindex);

    // check for start of iteration
    if (VALUE_ISA_NULL(GET_VALUE(1))) RETURN_VALUE(VALUE_FROM_INT(0), rindex);

    // extract value
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("Iterator expects a numeric value here.");

    // compute new value
    gravity_int_t n = value.n;
    if (n+1 < count) {
        ++n;
    } else {
        RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    }

    // return new iterator
    RETURN_VALUE(VALUE_FROM_INT(n), rindex);
}